

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

TValue * luaV_tonumber(TValue *obj,TValue *n)

{
  int iVar1;
  TValue *i_o;
  lua_Number num;
  Value local_10;
  
  if (obj->tt != 3) {
    if ((obj->tt == 4) &&
       (iVar1 = luaO_str2d((char *)&(((obj->value).gc)->h).array,&local_10.n), iVar1 != 0)) {
      n->value = local_10;
      n->tt = 3;
      obj = n;
    }
    else {
      obj = (TValue *)0x0;
    }
  }
  return obj;
}

Assistant:

const TValue *luaV_tonumber (const TValue *obj, TValue *n) {
  lua_Number num;
  if (ttisnumber(obj)) return obj;
  if (ttisstring(obj) && luaO_str2d(svalue(obj), &num)) {
    setnvalue(n, num);
    return n;
  }
  else
    return NULL;
}